

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_send_text_frame_no_handler(void)

{
  cio_error cVar1;
  char data [5];
  cio_write_buffer wb;
  cio_write_buffer wbh;
  undefined4 local_48;
  undefined1 local_44;
  cio_write_buffer local_40;
  cio_write_buffer local_20;
  
  local_40.data.head.q_len = (size_t)&local_48;
  local_44 = 0x61;
  local_48 = 0x61616161;
  local_40.next = &local_20;
  local_20.next = &local_40;
  local_40.data.element.length = 5;
  local_20.data.head.q_len = 1;
  local_20.data.element.length = 5;
  local_40.prev = local_40.next;
  local_20.prev = local_20.next;
  cVar1 = cio_websocket_write_message_first_chunk
                    (ws,5,local_40.next,true,false,(cio_websocket_write_handler_t)0x0,(void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,"Writing a text frame with no handler did not fail!",0xac6,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_send_text_frame_no_handler(void)
{
	char data[5];
	memset(data, 'a', sizeof(data));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, data, sizeof(data));
	cio_write_buffer_queue_tail(&wbh, &wb);

	enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, false, NULL, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Writing a text frame with no handler did not fail!");
}